

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O2

void __thiscall Diligent::ShaderResourcesGL::~ShaderResourcesGL(ShaderResourcesGL *this)

{
  UniformBufferInfo *pUVar1;
  IMemoryAllocator *pIVar2;
  Uint32 ub;
  uint uVar3;
  
  for (uVar3 = 0; uVar3 < this->m_NumUniformBuffers; uVar3 = uVar3 + 1) {
    GetUniformBuffer(this,uVar3);
  }
  for (uVar3 = 0; uVar3 < this->m_NumTextures; uVar3 = uVar3 + 1) {
    GetTexture(this,uVar3);
  }
  for (uVar3 = 0; uVar3 < this->m_NumImages; uVar3 = uVar3 + 1) {
    GetImage(this,uVar3);
  }
  for (uVar3 = 0; uVar3 < this->m_NumStorageBlocks; uVar3 = uVar3 + 1) {
    GetStorageBlock(this,uVar3);
  }
  pUVar1 = this->m_UniformBuffers;
  if (pUVar1 != (UniformBufferInfo *)0x0) {
    pIVar2 = GetRawAllocator();
    (*pIVar2->_vptr_IMemoryAllocator[1])(pIVar2,pUVar1);
  }
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            (&this->m_UBReflectionBuffer);
  return;
}

Assistant:

ShaderResourcesGL::~ShaderResourcesGL()
{
    // clang-format off
    ProcessResources(
        [&](UniformBufferInfo& UB)
        {
            UB.~UniformBufferInfo();
        },
        [&](TextureInfo& Sam)
        {
            Sam.~TextureInfo();
        },
        [&](ImageInfo& Img)
        {
            Img.~ImageInfo();
        },
        [&](StorageBlockInfo& SB)
        {
            SB.~StorageBlockInfo();
        }
    );
    // clang-format on

    void* RawMemory = m_UniformBuffers;
    if (RawMemory != nullptr)
    {
        auto& MemAllocator = GetRawAllocator();
        MemAllocator.Free(RawMemory);
    }
}